

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.h
# Opt level: O1

void __thiscall psy::C::SyntaxWriterDOTFormat::~SyntaxWriterDOTFormat(SyntaxWriterDOTFormat *this)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->terminalShapes_);
  std::_Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>::
  ~_Deque_base((_Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
                *)&this->nodes_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->connections_);
  std::
  _Hashtable<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_psy::C::SyntaxNode_*,_std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::hash<const_psy::C::SyntaxNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->id_);
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

class PSY_C_API SyntaxWriterDOTFormat final : public SyntaxDumper
{
public:
    using SyntaxDumper::SyntaxDumper;

    void write(const SyntaxNode* node, const std::string& fileSuffix);
    void write(const SyntaxNode* node, const std::string& fileSuffix, std::ostream& os);

private:
    static std::string name(const SyntaxNode* node);

    void terminal(const SyntaxToken& tk, const SyntaxNode* node) override;
    std::string terminalId(unsigned token);
    std::string terminalId(const SyntaxToken& tk);

    void generateTokens();
    void alignTerminals();
    void nodeLabel(const SyntaxNode* node);

    bool preVisit(const SyntaxNode* node) override;
    void postVisit(const SyntaxNode*) override;

    std::unordered_map<const SyntaxNode*, std::string> id_;
    std::vector<std::pair<std::string, std::string>> connections_;
    std::stack<const SyntaxNode*> nodes_;
    std::vector<std::string> terminalShapes_;
    std::ostream* os_;
    int count_;
}